

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long_long value,FormatSpec spec)

{
  long lVar1;
  undefined4 uVar2;
  lconv *plVar3;
  size_t __n;
  byte *pbVar4;
  CharPtr pcVar5;
  byte bVar6;
  char *pcVar7;
  unsigned_long_long uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  CharPtr __dest;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined4 local_5c;
  char *local_58;
  ulong local_50;
  size_t local_48;
  CharPtr local_40;
  long local_38;
  
  uVar2 = spec._20_4_;
  local_5c = 0;
  uVar10 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar6 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar6 = 0x20;
    }
    local_5c = (uint)bVar6;
    uVar10 = 1;
  }
  spec._20_4_ = uVar2;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0010baf0;
      if (spec.type_ != 'B') goto code_r0x0010bc35;
    }
    else {
      if (spec.type_ == 'X') {
LAB_0010ba72:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar14 = (ulong)uVar10;
          *(undefined1 *)((long)&local_5c + uVar14) = 0x30;
          uVar10 = uVar10 | 2;
          *(char *)((long)&local_5c + uVar14 + 1) = spec.type_;
        }
        uVar11 = 0;
        uVar8 = value;
        do {
          uVar11 = uVar11 + 1;
          bVar16 = 0xf < uVar8;
          uVar8 = uVar8 >> 4;
        } while (bVar16);
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar11,&spec,(char *)&local_5c,uVar10);
        pcVar7 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar7 = "0123456789abcdef";
        }
        do {
          *pcVar5 = pcVar7[(uint)value & 0xf];
          pcVar5 = pcVar5 + -1;
          bVar16 = 0xf < value;
          value = value >> 4;
        } while (bVar16);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0010bc35;
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      uVar14 = (ulong)uVar10;
      *(undefined1 *)((long)&local_5c + uVar14) = 0x30;
      uVar10 = uVar10 | 2;
      *(char *)((long)&local_5c + uVar14 + 1) = spec.type_;
    }
    uVar11 = 0;
    uVar8 = value;
    do {
      uVar11 = uVar11 + 1;
      bVar16 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar16);
    pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar11,&spec,(char *)&local_5c,uVar10)
    ;
    do {
      *pbVar4 = (byte)value & 1 | 0x30;
      pbVar4 = pbVar4 + -1;
      bVar16 = 1 < value;
      value = value >> 1;
    } while (bVar16);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar14 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          *(undefined1 *)((long)&local_5c + uVar14) = 0x30;
        }
        uVar11 = 0;
        uVar8 = value;
        do {
          uVar11 = uVar11 + 1;
          bVar16 = 7 < uVar8;
          uVar8 = uVar8 >> 3;
        } while (bVar16);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar11,&spec,(char *)&local_5c,uVar10);
        do {
          *pbVar4 = (byte)value & 7 | 0x30;
          pbVar4 = pbVar4 + -1;
          bVar16 = 7 < value;
          value = value >> 3;
        } while (bVar16);
        return;
      }
      if (spec.type_ == 'x') goto LAB_0010ba72;
code_r0x0010bc35:
      internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        lVar1 = 0x3f;
        if ((value | 1) != 0) {
          for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar11 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
        plVar3 = localeconv();
        local_58 = plVar3->thousands_sep;
        __n = strlen(local_58);
        uVar11 = uVar11 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar11]);
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar11 + (int)__n * (uVar11 / 3) + 1,&spec,(char *)&local_5c,uVar10
                           );
        pcVar5 = pcVar5 + 1;
        if (value < 100) {
          bVar16 = false;
        }
        else {
          local_38 = -__n;
          iVar9 = -1;
          uVar15 = 1;
          iVar13 = -2;
          uVar14 = 2;
          uVar8 = value;
          local_48 = __n;
          do {
            value = uVar8 / 100;
            uVar12 = (ulong)(uint)(((int)uVar8 + (int)value * -100) * 2);
            pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                         [uVar12 + 1];
            __dest = pcVar5 + -1;
            if (((int)(uVar15 / 3) * 3 + iVar9 == 0) && (__dest = pcVar5 + -1 + local_38, __n != 0))
            {
              local_50 = uVar8;
              local_40 = __dest;
              memmove(__dest,local_58,__n);
              __dest = local_40;
              __n = local_48;
              uVar8 = local_50;
            }
            __dest[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                         [uVar12];
            pcVar5 = __dest + -1;
            uVar12 = uVar8;
            if (((int)(uVar14 / 3) * 3 + iVar13 == 0) && (pcVar5 = pcVar5 + local_38, __n != 0)) {
              local_50 = uVar8;
              memmove(pcVar5,local_58,__n);
              __n = local_48;
              uVar12 = local_50;
            }
            iVar9 = iVar9 + -2;
            uVar10 = (int)uVar15 + 2;
            uVar15 = (ulong)uVar10;
            iVar13 = iVar13 + -2;
            uVar14 = (ulong)((int)uVar14 + 2);
            uVar8 = value;
          } while (9999 < uVar12);
          bVar16 = iVar9 + (uVar10 / 3) * 3 == 0;
        }
        if (value < 10) {
          pcVar5[-1] = (byte)value | 0x30;
          return;
        }
        pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [(value * 2 & 0xffffffff) + 1];
        pcVar5 = pcVar5 + -1;
        if ((bVar16) && (pcVar5 = pcVar5 + -__n, __n != 0)) {
          memmove(pcVar5,local_58,__n);
        }
        pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [value * 2 & 0x1fffffffe];
        return;
      }
      goto code_r0x0010bc35;
    }
LAB_0010baf0:
    lVar1 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar11 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar11 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar11]))
                             + 1,&spec,(char *)&local_5c,uVar10);
    pcVar5 = pcVar5 + 1;
    uVar14 = value;
    if (99 < value) {
      do {
        value = uVar14 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uint)((int)uVar14 + (int)value * -100) * 2);
        pcVar5 = pcVar5 + -2;
        bVar16 = 9999 < uVar14;
        uVar14 = value;
      } while (bVar16);
    }
    if (value < 10) {
      pcVar5[-1] = (byte)value | 0x30;
    }
    else {
      pcVar5[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(value * 2 & 0xffffffff) + 1];
      pcVar5[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [value * 2 & 0x1fffffffe];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}